

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread-link.cpp
# Opt level: O0

ssize_t __thiscall rtosc::ThreadLink::read(ThreadLink *this,int __fd,void *__buf,size_t __nbytes)

{
  byte bVar1;
  size_t len;
  ring_t r [2];
  undefined1 in_stack_ffffffffffffffdf;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  ring_t *in_stack_ffffffffffffffe8;
  undefined7 in_stack_fffffffffffffff0;
  
  bVar1 = (byte)__fd & 1;
  ring_read_vector((ringbuffer_t *)
                   (CONCAT17((byte)__fd,in_stack_fffffffffffffff0) & 0x1ffffffffffffff),
                   in_stack_ffffffffffffffe8,(bool)in_stack_ffffffffffffffe7);
  rtosc_message_ring_length(in_stack_ffffffffffffffe8);
  ring_read((ringbuffer_t *)CONCAT17(bVar1,in_stack_fffffffffffffff0),
            (char *)in_stack_ffffffffffffffe8,
            CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),
            (bool)in_stack_ffffffffffffffdf);
  return (ssize_t)this->read_buffer;
}

Assistant:

msg_t ThreadLink::read(bool lookahead) {
    ring_t r[2];
    ring_read_vector(ring,r,lookahead);
    const size_t len =
        rtosc_message_ring_length(r);
    assert(ring_read_size(ring, lookahead) >= len);
    assert(len <= MaxMsg);
    ring_read(ring, read_buffer, len, lookahead);
    return read_buffer;
}